

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

VRRStep * __thiscall
OSTEI_VRR_Algorithm_Base::Create_Single_
          (OSTEI_VRR_Algorithm_Base *this,Quartet *q,RRStepType rrstep)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  int in_ECX;
  long *in_RSI;
  VRRStep *in_RDI;
  int istep;
  VRRStep *vs;
  size_type in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  value_type_conflict vVar5;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar6;
  
  (**(code **)(*in_RSI + 0x10))();
  XYZStepToIdx(in_RDI->xyz);
  (in_RDI->ijkl)._M_elems[0] = 0;
  (in_RDI->ijkl)._M_elems[1] = 0;
  (in_RDI->ijkl)._M_elems[2] = 0;
  (in_RDI->ijkl)._M_elems[3] = 0;
  if (in_ECX != 0) {
    if (in_ECX != 1) {
      if (in_ECX != 2) {
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
        bVar2 = Quartet::operator_cast_to_bool
                          ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
        ;
        if (bVar2) {
LAB_0011faaa:
          pvVar3 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18);
          vVar5 = *pvVar3;
          pvVar4 = std::array<int,_4UL>::operator[]
                             ((array<int,_4UL> *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18);
          *pvVar4 = vVar5;
        }
        else {
          std::array<Quartet,_8UL>::operator[]
                    ((array<Quartet,_8UL> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff18);
          bVar2 = Quartet::operator_cast_to_bool
                            ((Quartet *)
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          if (bVar2) goto LAB_0011faaa;
        }
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
        bVar2 = Quartet::operator_cast_to_bool
                          ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
        ;
        if (!bVar2) {
          std::array<Quartet,_8UL>::operator[]
                    ((array<Quartet,_8UL> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff18);
          bVar2 = Quartet::operator_cast_to_bool
                            ((Quartet *)
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          if (!bVar2) goto LAB_0011fb93;
        }
        pvVar3 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
        iVar1 = *pvVar3;
        pvVar4 = std::array<int,_4UL>::operator[]
                           ((array<int,_4UL> *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
        *pvVar4 = iVar1 + -1;
LAB_0011fb93:
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
        bVar2 = Quartet::operator_cast_to_bool
                          ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
        ;
        if (bVar2) {
          pvVar3 = std::array<int,_3UL>::operator[]
                             ((array<int,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18);
          vVar5 = *pvVar3;
          pvVar4 = std::array<int,_4UL>::operator[]
                             ((array<int,_4UL> *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff18);
          *pvVar4 = vVar5;
        }
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
        bVar2 = Quartet::operator_cast_to_bool
                          ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
        ;
        uVar6 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff24);
        if (!bVar2) {
          return in_RDI;
        }
        pvVar3 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)CONCAT44(uVar6,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
        vVar5 = *pvVar3;
        pvVar4 = std::array<int,_4UL>::operator[]
                           ((array<int,_4UL> *)CONCAT44(uVar6,vVar5),in_stack_ffffffffffffff18);
        *pvVar4 = vVar5;
        return in_RDI;
      }
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      bVar2 = Quartet::operator_cast_to_bool
                        ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      if (bVar2) {
LAB_0011f87d:
        pvVar3 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
        iVar1 = *pvVar3;
        pvVar4 = std::array<int,_4UL>::operator[]
                           ((array<int,_4UL> *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
        *pvVar4 = iVar1 + -1;
      }
      else {
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
        bVar2 = Quartet::operator_cast_to_bool
                          ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
        ;
        if (bVar2) goto LAB_0011f87d;
      }
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      bVar2 = Quartet::operator_cast_to_bool
                        ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      if (!bVar2) {
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
        bVar2 = Quartet::operator_cast_to_bool
                          ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
        ;
        if (!bVar2) goto LAB_0011f966;
      }
      pvVar3 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
      vVar5 = *pvVar3;
      pvVar4 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
      *pvVar4 = vVar5;
LAB_0011f966:
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      bVar2 = Quartet::operator_cast_to_bool
                        ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      if (bVar2) {
        pvVar3 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
        vVar5 = *pvVar3;
        pvVar4 = std::array<int,_4UL>::operator[]
                           ((array<int,_4UL> *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
        *pvVar4 = vVar5;
      }
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      bVar2 = Quartet::operator_cast_to_bool
                        ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      if (!bVar2) {
        return in_RDI;
      }
      pvVar3 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
      vVar5 = *pvVar3;
      pvVar4 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
      *pvVar4 = vVar5;
      return in_RDI;
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    bVar2 = Quartet::operator_cast_to_bool
                      ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (bVar2) {
LAB_0011f642:
      pvVar3 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
      vVar5 = *pvVar3;
      pvVar4 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
      *pvVar4 = vVar5;
    }
    else {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      bVar2 = Quartet::operator_cast_to_bool
                        ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      if (bVar2) goto LAB_0011f642;
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    bVar2 = Quartet::operator_cast_to_bool
                      ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (!bVar2) {
      std::array<Quartet,_8UL>::operator[]
                ((array<Quartet,_8UL> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      bVar2 = Quartet::operator_cast_to_bool
                        ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      if (!bVar2) goto LAB_0011f722;
    }
    pvVar3 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
    iVar1 = *pvVar3;
    pvVar4 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
    *pvVar4 = iVar1 + -1;
LAB_0011f722:
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    bVar2 = Quartet::operator_cast_to_bool
                      ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (bVar2) {
      pvVar3 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
      vVar5 = *pvVar3;
      pvVar4 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
      *pvVar4 = vVar5;
    }
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    bVar2 = Quartet::operator_cast_to_bool
                      ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (!bVar2) {
      return in_RDI;
    }
    pvVar3 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
    vVar5 = *pvVar3;
    pvVar4 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
    *pvVar4 = vVar5;
    return in_RDI;
  }
  std::array<Quartet,_8UL>::operator[]
            ((array<Quartet,_8UL> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  bVar2 = Quartet::operator_cast_to_bool
                    ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (bVar2) {
LAB_0011f3d9:
    pvVar3 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
    iVar1 = *pvVar3;
    pvVar4 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
    *pvVar4 = iVar1 + -1;
  }
  else {
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    bVar2 = Quartet::operator_cast_to_bool
                      ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (bVar2) goto LAB_0011f3d9;
  }
  std::array<Quartet,_8UL>::operator[]
            ((array<Quartet,_8UL> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  bVar2 = Quartet::operator_cast_to_bool
                    ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (!bVar2) {
    std::array<Quartet,_8UL>::operator[]
              ((array<Quartet,_8UL> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    bVar2 = Quartet::operator_cast_to_bool
                      ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (!bVar2) goto LAB_0011f4e7;
  }
  pvVar3 = std::array<int,_3UL>::operator[]
                     ((array<int,_3UL> *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff18);
  vVar5 = *pvVar3;
  pvVar4 = std::array<int,_4UL>::operator[]
                     ((array<int,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff18);
  *pvVar4 = vVar5;
LAB_0011f4e7:
  std::array<Quartet,_8UL>::operator[]
            ((array<Quartet,_8UL> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  bVar2 = Quartet::operator_cast_to_bool
                    ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (bVar2) {
    pvVar3 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
    vVar5 = *pvVar3;
    pvVar4 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
    *pvVar4 = vVar5;
  }
  std::array<Quartet,_8UL>::operator[]
            ((array<Quartet,_8UL> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  bVar2 = Quartet::operator_cast_to_bool
                    ((Quartet *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (bVar2) {
    pvVar3 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
    vVar5 = *pvVar3;
    pvVar4 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
    *pvVar4 = vVar5;
  }
  return in_RDI;
}

Assistant:

VRRStep OSTEI_VRR_Algorithm_Base::Create_Single_(Quartet q, RRStepType rrstep)
{
    VRRStep vs = VRRStep_(q, rrstep);

    // fill in the ijkl members
    int istep = XYZStepToIdx(vs.xyz);
    vs.ijkl = {0, 0, 0, 0};
    if(rrstep == RRStepType::I)
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[0] = q.bra.left.ijk[istep]-1;
        if(vs.src[4] || vs.src[5])
            vs.ijkl[1] = q.bra.right.ijk[istep];
        if(vs.src[6])
            vs.ijkl[2] = q.ket.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[3] = q.ket.right.ijk[istep];
    }
    else if(rrstep == RRStepType::J)
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[0] = q.bra.left.ijk[istep];
        if(vs.src[4] || vs.src[5])
            vs.ijkl[1] = q.bra.right.ijk[istep]-1;
        if(vs.src[6])
            vs.ijkl[2] = q.ket.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[3] = q.ket.right.ijk[istep];
    }
    else if(rrstep == RRStepType::K)
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[2] = q.ket.left.ijk[istep]-1;
        if(vs.src[4] || vs.src[5])
            vs.ijkl[3] = q.ket.right.ijk[istep];
        if(vs.src[6])
            vs.ijkl[0] = q.bra.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[1] = q.bra.right.ijk[istep];
    }
    else
    {
        if(vs.src[2] || vs.src[3])
            vs.ijkl[2] = q.ket.left.ijk[istep];
        if(vs.src[4] || vs.src[5])
            vs.ijkl[3] = q.ket.right.ijk[istep]-1;
        if(vs.src[6])
            vs.ijkl[0] = q.bra.left.ijk[istep];
        if(vs.src[7])
            vs.ijkl[1] = q.bra.right.ijk[istep];
    }

    return vs;
}